

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

AST_NodePtr __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::parse_internal(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                 *this,string *t_input,string *t_fname)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char *pcVar1;
  long *plVar2;
  long *plVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  pointer pcVar7;
  Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this_01;
  eval_error *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer pcVar8;
  pointer *__ptr;
  pointer *__ptr_2;
  long *plVar9;
  string local_78;
  File_Position local_50;
  string local_48;
  
  pcVar7 = (pointer)t_fname->_M_string_length;
  pcVar8 = pcVar7;
  if (pcVar7 != (pointer)0x0) {
    pcVar8 = (t_fname->_M_dataplus)._M_p;
  }
  pcVar7 = pcVar7 + (long)pcVar8;
  if (pcVar8 == (pointer)0x0) {
    pcVar7 = (pointer)0x0;
  }
  *(undefined8 *)((long)&t_input[1].field_2 + 8) = 0x100000001;
  t_input[2]._M_dataplus._M_p = pcVar8;
  t_input[2]._M_string_length = (size_type)pcVar7;
  *(undefined4 *)&t_input[2].field_2 = 1;
  local_78._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_78,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_50,in_RCX);
  sVar5 = local_78._M_string_length;
  _Var4._M_p = local_78._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&t_input->field_2 + 8);
  (t_input->field_2)._M_allocated_capacity = (size_type)_Var4._M_p;
  *(size_type *)((long)&t_input->field_2 + 8) = sVar5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
  }
  if ((((1 < t_fname->_M_string_length) && (pcVar1 = (t_fname->_M_dataplus)._M_p, *pcVar1 == '#'))
      && (pcVar1[1] == '!')) &&
     (t_input[2]._M_dataplus._M_p != (pointer)t_input[2]._M_string_length)) {
    do {
      bVar6 = Eol((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                   *)t_input);
      if (bVar6) break;
      Position::operator++((Position *)((long)&t_input[1].field_2 + 8));
    } while (t_input[2]._M_dataplus._M_p != (pointer)t_input[2]._M_string_length);
  }
  bVar6 = Statements((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                      *)t_input,true);
  if (bVar6) {
    if (t_input[2]._M_dataplus._M_p != (pointer)t_input[2]._M_string_length) {
      this_02 = (eval_error *)__cxa_allocate_exception(0x90);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Unparsed input","");
      local_50 = *(File_Position *)((long)&t_input[1].field_2 + 8);
      exception::eval_error::eval_error
                (this_02,&local_78,&local_50,(string *)(t_input->field_2)._M_allocated_capacity);
      __cxa_throw(this_02,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48);
    ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    build_match<chaiscript::eval::File_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)t_input,0,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_01 = (Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
              operator_new(0x78);
    eval::Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
    Noop_AST_Node(this_01);
    local_78._M_dataplus._M_p = (pointer)this_01;
    std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
    ::
    emplace_back<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>
              ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>>>
                *)(t_input + 1),
               (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
                *)&local_78);
    if ((Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
        local_78._M_dataplus._M_p !=
        (Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 0x18))();
    }
  }
  pcVar7 = t_input[1]._M_dataplus._M_p;
  pcVar7[0] = '\0';
  pcVar7[1] = '\0';
  pcVar7[2] = '\0';
  pcVar7[3] = '\0';
  pcVar7[4] = '\0';
  pcVar7[5] = '\0';
  pcVar7[6] = '\0';
  pcVar7[7] = '\0';
  (this->super_ChaiScript_Parser_Base)._vptr_ChaiScript_Parser_Base = *(_func_int ***)pcVar7;
  plVar2 = (long *)t_input[1]._M_dataplus._M_p;
  plVar3 = (long *)t_input[1]._M_string_length;
  plVar9 = plVar2;
  if (plVar3 != plVar2) {
    do {
      if ((long *)*plVar9 != (long *)0x0) {
        (**(code **)(*(long *)*plVar9 + 0x18))();
      }
      *plVar9 = 0;
      plVar9 = plVar9 + 1;
    } while (plVar9 != plVar3);
    t_input[1]._M_string_length = (size_type)plVar2;
  }
  return (__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
          )(__uniq_ptr_data<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>,_true,_true>
            )this;
}

Assistant:

AST_NodePtr parse_internal(const std::string &t_input, std::string t_fname) {
        const auto begin = t_input.empty() ? nullptr : &t_input.front();
        const auto end = begin == nullptr ? nullptr : begin + t_input.size();
        m_position = Position(begin, end);
        m_filename = std::make_shared<std::string>(std::move(t_fname));

        if ((t_input.size() > 1) && (t_input[0] == '#') && (t_input[1] == '!')) {
          while (m_position.has_more() && (!Eol())) {
            ++m_position;
          }
        }

        if (Statements(true)) {
          if (m_position.has_more()) {
            throw exception::eval_error("Unparsed input", File_Position(m_position.line, m_position.col), *m_filename);
          } else {
            build_match<eval::File_AST_Node<Tracer>>(0);
          }
        } else {
          m_match_stack.push_back(chaiscript::make_unique<eval::AST_Node_Impl<Tracer>, eval::Noop_AST_Node<Tracer>>());
        }

        AST_NodePtr retval(std::move(m_match_stack.front()));
        m_match_stack.clear();
        return retval;
      }